

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O1

string * QPDF::compute_data_key
                   (string *__return_storage_ptr__,string *encryption_key,int objid,int generation,
                   bool use_aes,int encryption_V,int encryption_R)

{
  pointer pcVar1;
  undefined4 in_register_0000000c;
  uchar *puVar2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t n;
  char *d;
  MD5 md5;
  Digest digest;
  _Alloc_hider local_78;
  uchar *local_70;
  char local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  MD5 local_58;
  uchar local_48 [24];
  
  pcVar1 = (encryption_key->_M_dataplus)._M_p;
  local_78._M_p = &local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + encryption_key->_M_string_length,
             CONCAT44(in_register_0000000c,generation));
  if (encryption_V < 5) {
    std::__cxx11::string::_M_replace_aux((ulong)&local_78,(ulong)local_70,0,'\x01');
    std::__cxx11::string::_M_replace_aux((ulong)&local_78,(ulong)local_70,0,'\x01');
    std::__cxx11::string::_M_replace_aux((ulong)&local_78,(ulong)local_70,0,'\x01');
    std::__cxx11::string::_M_replace_aux((ulong)&local_78,(ulong)local_70,0,'\x01');
    puVar2 = (uchar *)0x1;
    d = (char *)local_70;
    std::__cxx11::string::_M_replace_aux((ulong)&local_78,(ulong)local_70,0,'\x01');
    n = extraout_RDX;
    if (use_aes) {
      d = "sAlT";
      std::__cxx11::string::append((char *)&local_78);
      n = extraout_RDX_00;
    }
    MD5::MD5(&local_58,(uchar *)d,n,puVar2);
    MD5::encodeDataIncrementally(&local_58,local_78._M_p,(size_t)local_70);
    MD5::digest(&local_58,local_48);
    puVar2 = (uchar *)0x10;
    if (local_70 < (uchar *)0x10) {
      puVar2 = local_70;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_48,local_48 + (long)puVar2);
    if (local_58.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_78._M_p == &local_68) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_67,local_68);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_60;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_78._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_67,local_68);
    }
    __return_storage_ptr__->_M_string_length = (size_type)local_70;
    local_70 = (uchar *)0x0;
    local_68 = '\0';
    local_78._M_p = &local_68;
  }
  if (local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,CONCAT71(uStack_67,local_68) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::compute_data_key(
    std::string const& encryption_key,
    int objid,
    int generation,
    bool use_aes,
    int encryption_V,
    int encryption_R)
{
    // Algorithm 3.1 from the PDF 1.7 Reference Manual

    std::string result = encryption_key;

    if (encryption_V >= 5) {
        // Algorithm 3.1a (PDF 1.7 extension level 3): just use encryption key straight.
        return result;
    }

    // Append low three bytes of object ID and low two bytes of generation
    result.append(1, static_cast<char>(objid & 0xff));
    result.append(1, static_cast<char>((objid >> 8) & 0xff));
    result.append(1, static_cast<char>((objid >> 16) & 0xff));
    result.append(1, static_cast<char>(generation & 0xff));
    result.append(1, static_cast<char>((generation >> 8) & 0xff));
    if (use_aes) {
        result += "sAlT";
    }

    MD5 md5;
    md5.encodeDataIncrementally(result.c_str(), result.length());
    MD5::Digest digest;
    md5.digest(digest);
    return {reinterpret_cast<char*>(digest), std::min(result.length(), toS(16))};
}